

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody
          (InterpreterTestSuite_PC_OpdatasetGetActive_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  PersistentStorage *pPVar1;
  bool bVar2;
  int iVar3;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar4;
  reference this_00;
  char *pcVar5;
  pointer message;
  char *expected_predicate_value;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l;
  string jsonStr;
  Action<void_(ot::commissioner::ActiveOperationalDataset_&)> converted;
  AssertionResult gtest_ar_2;
  NetworkId nwk_id;
  json json;
  AssertionResult gtest_ar_7;
  Value value;
  MatcherBase<ot::commissioner::ActiveOperationalDataset_&> local_290;
  Expression expr;
  _Invoker_type p_Stack_260;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_258;
  MatcherBase<unsigned_short> local_248;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_230;
  Network nwk;
  string local_1b8;
  _Any_data local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk_id);
  pPVar1 = (ctx.mRegistry)->mStorage;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&expr,0xffffffff);
  std::__cxx11::string::string((string *)&value,"",(allocator *)&gtest_ar_7);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&gtest_ar_2,"",(allocator *)&local_290);
  expected_predicate_value = (char *)0x0;
  ot::commissioner::persistent_storage::Network::Network
            (&nwk,(NetworkId *)&converted,(DomainId *)&expr,(string *)&value,1,0,0,
             (string *)&gtest_ar_2,0);
  iVar3 = (*pPVar1->_vptr_PersistentStorage[6])(pPVar1,&nwk,&nwk_id);
  json.m_type = (value_t)iVar3;
  local_248._vptr_MatcherBase._0_1_ = 0;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&jsonStr,
             "ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, \"\", 1, 0, 0, \"\", 0}, nwk_id)"
             ,"PersistentStorage::Status::kSuccess",&json.m_type,(Status *)&local_248);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&value);
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&nwk);
    if (jsonStr._M_string_length != 0) {
      pcVar5 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jsonStr._M_string_length);
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  iVar3 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                    ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  gtest_ar_2.success_ = SUB41(iVar3,0);
  jsonStr._M_dataplus._M_p = jsonStr._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&value,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",&gtest_ar_2.success_,(Status *)&jsonStr);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&value.mError.mMessage);
  ot::commissioner::utils::Hex<unsigned_short>((string *)&value,nwk.mPan);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&gtest_ar_2,"utils::Hex(nwk.mPan)","\"0x0000\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
             (char (*) [7])"0x0000");
  std::__cxx11::string::~string((string *)&value);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  testing::A<ot::commissioner::ActiveOperationalDataset&>();
  testing::A<unsigned_short>();
  CommissionerAppMock::gmock_GetActiveDataset
            ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)&gtest_ar_2,
             ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Matcher<ot::commissioner::ActiveOperationalDataset_&> *)&local_290,
             (Matcher<unsigned_short> *)&local_248);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::
           MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
           ::InternalExpectedAt
                     ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                       *)&gtest_ar_2,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x771,"*ctx.mDefaultCommissionerObject","GetActiveDataset(_, _)");
  pTVar4 = testing::internal::
           TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
           ::Times(pTVar4,2);
  local_178._0_4_ = kNone;
  local_170._M_p = (pointer)&local_160;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  testing::Return<ot::commissioner::Error>((testing *)&local_258,(Error *)local_178);
  std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_230,&local_258);
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  converted.fun_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_manager;
  converted.fun_._M_invoker =
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&jsonStr);
  std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
            ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)&expr,&converted.fun_)
  ;
  json.m_type = null;
  json._1_7_ = 0;
  json.m_value.object = (object_t *)0x0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  json._0_8_ = operator_new(0x20);
  *(undefined8 *)json._0_8_ = 0;
  *(undefined8 *)(json._0_8_ + 8) = 0;
  *(undefined8 *)(json._0_8_ + 0x10) = 0;
  *(_Invoker_type *)(json._0_8_ + 0x18) = p_Stack_260;
  if (expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(pointer *)json._0_8_ =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(json._0_8_ + 8) =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(json._0_8_ + 0x10) =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    expr.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  json.m_value.number_unsigned = jsonStr._M_string_length;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  std::_Function_base::~_Function_base((_Function_base *)&jsonStr);
  std::_Function_base::~_Function_base((_Function_base *)&expr);
  std::_Function_base::~_Function_base((_Function_base *)&converted);
  __l._M_len = 1;
  __l._M_array = (iterator)&json;
  std::
  vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
  ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
            *)&value,__l,(allocator_type *)&jsonStr);
  std::_Function_base::~_Function_base((_Function_base *)&json);
  __return_storage_ptr__ = &value.mError.mMessage.field_2;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)__return_storage_ptr__,(ReturnAction *)&local_230);
  gtest_ar_7.success_ = false;
  gtest_ar_7._1_7_ = 0;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  gtest_ar_7._0_8_ = operator_new(0x38);
  *(undefined8 *)gtest_ar_7._0_8_ = value.mError._0_8_;
  *(pointer *)(gtest_ar_7._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
  *(size_type *)(gtest_ar_7._0_8_ + 0x10) = value.mError.mMessage._M_string_length;
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
  value.mError.mMessage._M_string_length = 0;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x18) = 0;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x20) = 0;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x28) = 0;
  *(size_type *)(gtest_ar_7._0_8_ + 0x30) = value.mData._M_string_length;
  if (value.mData._M_dataplus._M_p != (pointer)0x0) {
    *(ulong *)(gtest_ar_7._0_8_ + 0x18) =
         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                  value.mError.mMessage.field_2._M_local_buf[0]);
    *(undefined8 *)(gtest_ar_7._0_8_ + 0x20) = value.mError.mMessage.field_2._8_8_;
    *(pointer *)(gtest_ar_7._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
    value.mData._M_dataplus._M_p = (pointer)0x0;
    value.mData._M_string_length = 0;
  }
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )jsonStr._M_string_length;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  std::_Function_base::~_Function_base((_Function_base *)&jsonStr);
  anon_func::Op::~Op((Op *)&value);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  ::WillRepeatedly(pTVar4,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                           *)&gtest_ar_7);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  std::__cxx11::string::~string((string *)&local_170);
  std::
  _Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
                  *)&gtest_ar_2.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_248);
  testing::internal::MatcherBase<ot::commissioner::ActiveOperationalDataset_&>::~MatcherBase
            (&local_290);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
  value.mError.mMessage._M_string_length = 0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&gtest_ar_2,"opdataset get active",(allocator *)&converted)
  ;
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&jsonStr,&ctx.mInterpreter,(string *)&gtest_ar_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_2,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_2);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_2);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar2;
  jsonStr._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&converted);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&jsonStr,(AssertionResult *)0x27400f,"false","true"
               ,expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x780,(char *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&converted);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    if (converted.fun_.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
      (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jsonStr._M_string_length);
  iVar3 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                    ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  jsonStr._M_dataplus._M_p._0_1_ = (char)iVar3;
  converted.fun_.super__Function_base._M_functor._M_unused._M_member_pointer =
       converted.fun_.super__Function_base._M_functor._M_unused._M_member_pointer &
       0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&gtest_ar_2,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",(Status *)&jsonStr,(Status *)&converted);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&jsonStr);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x782,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  jsonStr._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar_2,"nwk.mPan","0x0001",&nwk.mPan,(int *)&jsonStr);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&jsonStr);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x783,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,"opdataset get active --export ./tmp/aods.json",
             (allocator *)&converted);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&jsonStr,&ctx.mInterpreter,(string *)&gtest_ar_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_2,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_2);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_2);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar2;
  jsonStr._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&converted);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&jsonStr,(AssertionResult *)0x27400f,"false","true"
               ,expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x787,(char *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&converted);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    if (converted.fun_.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
      (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jsonStr._M_string_length);
  ot::commissioner::Interpreter::PrintOrExport(&ctx.mInterpreter,&value);
  std::__cxx11::string::string((string *)&local_1b8,"./tmp/aods.json",(allocator *)&gtest_ar_7);
  ot::commissioner::PathExists((Error *)&gtest_ar_2,&local_1b8);
  converted.fun_.super__Function_base._M_functor._0_4_ = gtest_ar_2._0_4_;
  json._0_8_ = json._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&jsonStr,"PathExists(\"./tmp/aods.json\").GetCode()","ErrorCode::kNone",
             (ErrorCode *)&converted,(ErrorCode *)&json);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (jsonStr._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x789,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jsonStr._M_string_length);
  jsonStr._M_dataplus._M_p = (pointer)&jsonStr.field_2;
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_allocated_capacity = jsonStr.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  std::__cxx11::string::string((string *)&converted,"./tmp/aods.json",(allocator *)&local_248);
  ot::commissioner::ReadFile((Error *)&gtest_ar_2,&jsonStr,(string *)&converted);
  gtest_ar_7.success_ = gtest_ar_2.success_;
  gtest_ar_7._1_3_ = gtest_ar_2._1_3_;
  local_290._vptr_MatcherBase._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&json,"ReadFile(jsonStr, \"./tmp/aods.json\").GetCode()","ErrorCode::kNone"
             ,(ErrorCode *)&gtest_ar_7,(ErrorCode *)&local_290);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&converted);
  if (json.m_type == null) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (json.m_value.object == (object_t *)0x0) {
      message = (pointer)0x2973f5;
    }
    else {
      message = ((json.m_value.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78c,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&json.m_value);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)&gtest_ar_2,&jsonStr);
  local_188 = 0;
  uStack_180 = 0;
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)&gtest_ar_2,(parser_callback_t *)&local_198,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(&json,(char (*) [6])0x2785ea);
  converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar2;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&converted,
               (AssertionResult *)"json.contains(\"PanId\")","false","true",expected_predicate_value
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78e,(char *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&converted.fun_.super__Function_base._M_functor + 8));
  std::__cxx11::string::string((string *)&converted,"PanId",(allocator *)&local_290);
  this_00 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(&json,(key_type *)&converted);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             this_00);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"\"0x0001\"","json.at(\"PanId\").get<std::string>().c_str()",
             "0x0001",(char *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_));
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&converted);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  std::__cxx11::string::~string((string *)&jsonStr);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  ot::commissioner::persistent_storage::Network::~Network(&nwk);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetActive)
{
    TestContext ctx;
    InitContext(ctx);

    NetworkId nwk_id;
    EXPECT_EQ(ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, "", 1, 0, 0, "", 0}, nwk_id),
              PersistentStorage::Status::kSuccess);
    Network nwk;
    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(utils::Hex(nwk.mPan), "0x0000");

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetActiveDataset(_, _))
        .Times(2)
        .WillRepeatedly(DoAll(WithArg<0>([](ActiveOperationalDataset &a) {
                                  a.mExtendedPanId = ByteArray{0, 0, 0, 0, 0, 0, 0, 1};
                                  a.mPanId         = 1;
                                  a.mPresentFlags =
                                      ActiveOperationalDataset::kPanIdBit | ActiveOperationalDataset::kExtendedPanIdBit;
                              }),
                              Return(Error{})));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nwk.mPan, 0x0001);

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active --export ./tmp/aods.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    EXPECT_EQ(PathExists("./tmp/aods.json").GetCode(), ErrorCode::kNone);

    std::string jsonStr;
    EXPECT_EQ(ReadFile(jsonStr, "./tmp/aods.json").GetCode(), ErrorCode::kNone);
    nlohmann::json json = nlohmann::json::parse(jsonStr);
    EXPECT_TRUE(json.contains("PanId"));
    EXPECT_STREQ("0x0001", json.at("PanId").get<std::string>().c_str());
}